

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_t.cpp
# Opt level: O0

void __thiscall deci::array_t::~array_t(array_t *this)

{
  bool bVar1;
  reference ppvVar2;
  value_t *el;
  iterator __end1;
  iterator __begin1;
  element_t *__range1;
  array_t *this_local;
  
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_0010ed00;
  __end1 = std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::begin(&this->elements);
  el = (value_t *)
       std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::end(&this->elements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<deci::value_t_**,_std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>_>
                                *)&el);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<deci::value_t_**,_std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>_>
              ::operator*(&__end1);
    (*(*ppvVar2)->_vptr_value_t[3])();
    __gnu_cxx::
    __normal_iterator<deci::value_t_**,_std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::~vector(&this->elements);
  value_t::~value_t(&this->super_value_t);
  return;
}

Assistant:

array_t::~array_t() {
      for (auto el: this->elements) {
        el->Delete();
      }
    }